

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O1

string * __thiscall
Type::DataSize_abi_cxx11_
          (string *__return_storage_ptr__,Type *this,Output *out_cc,Env *env,DataPtr *data)

{
  Field *pFVar1;
  bool bVar2;
  uint uVar3;
  char *__s;
  ID *pIVar4;
  allocator<char> local_29;
  
  if (this->attr_length_expr_ != (Expr *)0x0) {
    EvalLengthExpr_abi_cxx11_(__return_storage_ptr__,this,out_cc,env);
    return __return_storage_ptr__;
  }
  uVar3 = (*(this->super_DataDepElement)._vptr_DataDepElement[0x13])(this);
  if (-1 < (int)uVar3) {
    strfmt_abi_cxx11_(__return_storage_ptr__,"%d",(ulong)uVar3);
    return __return_storage_ptr__;
  }
  pFVar1 = this->size_var_field_;
  if ((pFVar1 != (Field *)0x0) && (pFVar1->id_ != (ID *)0x0)) {
    if (pFVar1 == (Field *)0x0) {
      pIVar4 = (ID *)0x0;
    }
    else {
      pIVar4 = pFVar1->id_;
    }
    bVar2 = Env::Evaluated(env,pIVar4);
    if (bVar2) goto LAB_00128519;
  }
  (*(this->super_DataDepElement)._vptr_DataDepElement[0x1a])(this,out_cc,env,data);
LAB_00128519:
  if (this->size_var_field_ == (Field *)0x0) {
    pIVar4 = (ID *)0x0;
  }
  else {
    pIVar4 = this->size_var_field_->id_;
  }
  __s = Env::RValue(env,pIVar4);
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_29)
  ;
  return __return_storage_ptr__;
}

Assistant:

string Type::DataSize(Output* out_cc, Env* env, const DataPtr& data)
	{
	if ( attr_length_expr_ )
		return EvalLengthExpr(out_cc, env);

	int ss = StaticSize(env);
	if ( ss >= 0 )
		{
		return strfmt("%d", ss);
		}
	else
		{
		if ( ! size_var() || ! env->Evaluated(size_var()) )
			{
			ASSERT(out_cc != 0);
			GenDynamicSize(out_cc, env, data);
			ASSERT(size_var());
			}
		return env->RValue(size_var());
		}
	}